

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdownhighlighter.cpp
# Opt level: O0

void balancePairs(QVector<Delimiter> *delims)

{
  qsizetype qVar1;
  const_reference pDVar2;
  const_reference pDVar3;
  reference pDVar4;
  bool bVar5;
  bool oddMatch;
  Delimiter *curDelim;
  int j;
  Delimiter *lastDelim;
  int i;
  QVector<Delimiter> *delims_local;
  
  lastDelim._4_4_ = 0;
  do {
    qVar1 = QList<Delimiter>::length(delims);
    if (qVar1 <= lastDelim._4_4_) {
      return;
    }
    pDVar2 = QList<Delimiter>::at(delims,(long)lastDelim._4_4_);
    if ((pDVar2->close & 1U) != 0) {
      for (curDelim._4_4_ = (lastDelim._4_4_ - pDVar2->jump) + -1; -1 < curDelim._4_4_;
          curDelim._4_4_ = curDelim._4_4_ - (pDVar3->jump + 1)) {
        pDVar3 = QList<Delimiter>::at(delims,(long)curDelim._4_4_);
        if ((((pDVar3->open & 1U) != 0) && (pDVar3->marker == pDVar2->marker)) && (pDVar3->end < 0))
        {
          if ((((pDVar3->close & 1U) != 0) || (bVar5 = false, (pDVar2->open & 1U) != 0)) &&
             ((bVar5 = false, pDVar3->len != -1 && (bVar5 = false, pDVar2->len != -1)))) {
            bVar5 = (pDVar3->len + pDVar2->len) % 3 == 0;
          }
          if (!bVar5) {
            pDVar4 = QList<Delimiter>::operator[](delims,(long)lastDelim._4_4_);
            pDVar4->jump = lastDelim._4_4_ - curDelim._4_4_;
            pDVar4 = QList<Delimiter>::operator[](delims,(long)lastDelim._4_4_);
            pDVar4->open = false;
            pDVar4 = QList<Delimiter>::operator[](delims,(long)curDelim._4_4_);
            pDVar4->end = lastDelim._4_4_;
            pDVar4 = QList<Delimiter>::operator[](delims,(long)curDelim._4_4_);
            pDVar4->jump = 0;
            break;
          }
        }
      }
    }
    lastDelim._4_4_ = lastDelim._4_4_ + 1;
  } while( true );
}

Assistant:

void balancePairs(QVector<Delimiter> &delims) {
    for (int i = 0; i < delims.length(); ++i) {
        const auto &lastDelim = delims.at(i);

        if (!lastDelim.close) continue;

        int j = i - lastDelim.jump - 1;

        while (j >= 0) {
            const auto &curDelim = delims.at(j);
            if (curDelim.open && curDelim.marker == lastDelim.marker &&
                curDelim.end < 0) {
                const bool oddMatch = (curDelim.close || lastDelim.open) &&
                                      curDelim.len != -1 &&
                                      lastDelim.len != -1 &&
                                      (curDelim.len + lastDelim.len) % 3 == 0;
                if (!oddMatch) {
                    delims[i].jump = i - j;
                    delims[i].open = false;
                    delims[j].end = i;
                    delims[j].jump = 0;
                    break;
                }
            }
            j -= curDelim.jump + 1;
        }
    }
}